

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImGui::RenderRectFilledWithHole
               (ImDrawList *draw_list,ImRect outer,ImRect inner,ImU32 col,float rounding)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  ImVec2 local_a8;
  ImVec2 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  local_58 = inner.Max.y;
  local_28 = inner.Min.y;
  local_48 = outer.Max.y;
  local_38 = outer.Min.y;
  local_88._8_4_ = in_XMM1_Dc;
  local_88._0_4_ = outer.Max.x;
  local_88._4_4_ = outer.Max.y;
  local_88._12_4_ = in_XMM1_Dd;
  local_98._8_4_ = in_XMM3_Dc;
  local_98._0_4_ = inner.Max.x;
  local_98._4_4_ = inner.Max.y;
  local_98._12_4_ = in_XMM3_Dd;
  local_68._8_4_ = in_XMM2_Dc;
  local_68._0_4_ = inner.Min.x;
  local_68._4_4_ = inner.Min.y;
  local_68._12_4_ = in_XMM2_Dd;
  local_78._8_4_ = in_XMM0_Dc;
  local_78._0_4_ = outer.Min.x;
  local_78._4_4_ = outer.Min.y;
  local_78._12_4_ = in_XMM0_Dd;
  fStack_54 = local_58;
  fStack_50 = local_58;
  fStack_4c = local_58;
  fStack_44 = local_48;
  fStack_40 = local_48;
  fStack_3c = local_48;
  fStack_34 = local_38;
  fStack_30 = local_38;
  fStack_2c = local_38;
  fStack_24 = local_28;
  fStack_20 = local_28;
  fStack_1c = local_28;
  if (outer.Min.x < inner.Min.x) {
    local_a0.y = local_28;
    local_a0.x = outer.Min.x;
    local_a8.y = local_58;
    local_a8.x = inner.Min.x;
    ImDrawList::AddRectFilled
              (draw_list,&local_a0,&local_a8,col,rounding,
               (uint)(local_28 <= local_38) * 0x10 + (uint)(local_48 <= local_58) * 0x40 + 0x100);
  }
  if ((float)local_98._0_4_ < (float)local_88._0_4_) {
    local_a0.y = local_28;
    local_a0.x = (float)local_98._0_4_;
    local_a8.y = local_58;
    local_a8.x = (float)local_88._0_4_;
    ImDrawList::AddRectFilled
              (draw_list,&local_a0,&local_a8,col,rounding,
               (uint)(local_28 <= local_38) * 0x20 + (uint)(local_48 <= local_58) * 0x80 + 0x100);
  }
  if (local_38 < local_28) {
    local_a0.y = local_38;
    local_a0.x = (float)local_68._0_4_;
    local_a8.y = local_28;
    local_a8.x = (float)local_98._0_4_;
    ImDrawList::AddRectFilled
              (draw_list,&local_a0,&local_a8,col,rounding,
               (uint)((float)local_68._0_4_ <= (float)local_78._0_4_) * 0x10 +
               (uint)((float)local_88._0_4_ <= (float)local_98._0_4_) * 0x20 + 0x100);
  }
  if (local_58 < local_48) {
    local_a0.y = local_58;
    local_a0.x = (float)local_68._0_4_;
    local_a8.y = local_48;
    local_a8.x = (float)local_98._0_4_;
    ImDrawList::AddRectFilled
              (draw_list,&local_a0,&local_a8,col,rounding,
               (uint)((float)local_68._0_4_ <= (float)local_78._0_4_) * 0x40 +
               (uint)((float)local_88._0_4_ <= (float)local_98._0_4_) * 0x80 + 0x100);
  }
  auVar2 = local_68;
  auVar1 = local_78;
  if (((float)local_78._0_4_ < (float)local_68._0_4_) && (local_38 < local_28)) {
    local_a0.x = (float)local_78._0_4_;
    local_a0.y = (float)local_78._4_4_;
    local_a8.x = (float)local_68._0_4_;
    local_a8.y = (float)local_68._4_4_;
    local_78 = auVar1;
    local_68 = auVar2;
    ImDrawList::AddRectFilled(draw_list,&local_a0,&local_a8,col,rounding,0x10);
  }
  if (((float)local_98._0_4_ < (float)local_88._0_4_) && (local_38 < local_28)) {
    local_a0.y = local_38;
    local_a0.x = (float)local_98._0_4_;
    local_a8.y = local_28;
    local_a8.x = (float)local_88._0_4_;
    ImDrawList::AddRectFilled(draw_list,&local_a0,&local_a8,col,rounding,0x20);
  }
  if (((float)local_78._0_4_ < (float)local_68._0_4_) && (local_58 < local_48)) {
    local_a0.y = local_58;
    local_a0.x = (float)local_78._0_4_;
    local_a8.y = local_48;
    local_a8.x = (float)local_68._0_4_;
    ImDrawList::AddRectFilled(draw_list,&local_a0,&local_a8,col,rounding,0x40);
  }
  auVar2 = local_88;
  auVar1 = local_98;
  if (((float)local_98._0_4_ < (float)local_88._0_4_) && (local_58 < local_48)) {
    local_a0.x = (float)local_98._0_4_;
    local_a0.y = (float)local_98._4_4_;
    local_a8.x = (float)local_88._0_4_;
    local_a8.y = (float)local_88._4_4_;
    local_98 = auVar1;
    local_88 = auVar2;
    ImDrawList::AddRectFilled(draw_list,&local_a0,&local_a8,col,rounding,0x80);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledWithHole(ImDrawList* draw_list, ImRect outer, ImRect inner, ImU32 col, float rounding)
{
    const bool fill_L = (inner.Min.x > outer.Min.x);
    const bool fill_R = (inner.Max.x < outer.Max.x);
    const bool fill_U = (inner.Min.y > outer.Min.y);
    const bool fill_D = (inner.Max.y < outer.Max.y);
    if (fill_L) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Min.y), ImVec2(inner.Min.x, inner.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_U ? 0 : ImDrawFlags_RoundCornersTopLeft)    | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomLeft));
    if (fill_R) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Min.y), ImVec2(outer.Max.x, inner.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_U ? 0 : ImDrawFlags_RoundCornersTopRight)   | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_U) draw_list->AddRectFilled(ImVec2(inner.Min.x, outer.Min.y), ImVec2(inner.Max.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_L ? 0 : ImDrawFlags_RoundCornersTopLeft)    | (fill_R ? 0 : ImDrawFlags_RoundCornersTopRight));
    if (fill_D) draw_list->AddRectFilled(ImVec2(inner.Min.x, inner.Max.y), ImVec2(inner.Max.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_L ? 0 : ImDrawFlags_RoundCornersBottomLeft) | (fill_R ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_L && fill_U) draw_list->AddRectFilled(ImVec2(outer.Min.x, outer.Min.y), ImVec2(inner.Min.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopLeft);
    if (fill_R && fill_U) draw_list->AddRectFilled(ImVec2(inner.Max.x, outer.Min.y), ImVec2(outer.Max.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopRight);
    if (fill_L && fill_D) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Max.y), ImVec2(inner.Min.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomLeft);
    if (fill_R && fill_D) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Max.y), ImVec2(outer.Max.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomRight);
}